

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isofile_register_hardlink(archive_write *a,isofile *file)

{
  char *pcVar1;
  void *pvVar2;
  archive_rb_node *paVar3;
  archive_rb_tree *in_RSI;
  archive *in_RDI;
  char *pathname;
  hardlink *hl;
  iso9660_conflict *iso9660;
  archive_entry *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pvVar2 = *(void **)&in_RDI[1].current_codepage;
  archive_entry_set_nlink((archive_entry *)in_RSI[2].rbt_root,1);
  pcVar1 = archive_entry_hardlink(in_stack_ffffffffffffffc8);
  if (pcVar1 == (char *)0x0) {
    pvVar2 = malloc(0x30);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
      return -0x1e;
    }
    *(undefined4 *)((long)pvVar2 + 0x18) = 1;
    in_RSI[1].rbt_root = (archive_rb_node *)0x0;
    *(archive_rb_tree **)((long)pvVar2 + 0x20) = in_RSI;
    *(archive_rb_tree **)((long)pvVar2 + 0x28) = in_RSI + 1;
    __archive_rb_tree_insert_node
              ((archive_rb_tree *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (archive_rb_node *)in_RDI);
  }
  else {
    paVar3 = __archive_rb_tree_find_node(in_RSI,pvVar2);
    if (paVar3 != (archive_rb_node *)0x0) {
      in_RSI[1].rbt_root = (archive_rb_node *)0x0;
      *(archive_rb_tree **)paVar3[1].rb_info = in_RSI;
      paVar3[1].rb_info = (uintptr_t)(in_RSI + 1);
      *(int *)paVar3[1].rb_nodes = *(int *)paVar3[1].rb_nodes + 1;
    }
    archive_entry_unset_size((archive_entry *)0x17eead);
  }
  return 0;
}

Assistant:

static int
isofile_register_hardlink(struct archive_write *a, struct isofile *file)
{
	struct iso9660 *iso9660 = a->format_data;
	struct hardlink *hl;
	const char *pathname;

	archive_entry_set_nlink(file->entry, 1);
	pathname = archive_entry_hardlink(file->entry);
	if (pathname == NULL) {
		/* This `file` is a hardlink target. */
		hl = malloc(sizeof(*hl));
		if (hl == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		hl->nlink = 1;
		/* A hardlink target must be the first position. */
		file->hlnext = NULL;
		hl->file_list.first = file;
		hl->file_list.last = &(file->hlnext);
		__archive_rb_tree_insert_node(&(iso9660->hardlink_rbtree),
		    (struct archive_rb_node *)hl);
	} else {
		hl = (struct hardlink *)__archive_rb_tree_find_node(
		    &(iso9660->hardlink_rbtree), pathname);
		if (hl != NULL) {
			/* Insert `file` entry into the tail. */
			file->hlnext = NULL;
			*hl->file_list.last = file;
			hl->file_list.last = &(file->hlnext);
			hl->nlink++;
		}
		archive_entry_unset_size(file->entry);
	}

	return (ARCHIVE_OK);
}